

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O1

nsync_dll_list_ nsync::nsync_remove_from_mu_queue_(nsync_dll_list_ mu_queue,nsync_dll_element_ *e)

{
  int *piVar1;
  long lVar2;
  nsync_dll_element_ *n;
  nsync_dll_element_ *p;
  void *pvVar3;
  long lVar4;
  int iVar5;
  nsync_dll_list_ list;
  nsync_dll_element_ *pnVar6;
  bool bVar7;
  
  n = e->next;
  p = e->prev;
  list = nsync_dll_remove_(mu_queue,e);
  do {
    iVar5 = *(int *)((long)e->container + 0x48);
    piVar1 = (int *)((long)e->container + 0x48);
    LOCK();
    bVar7 = iVar5 == *piVar1;
    if (bVar7) {
      *piVar1 = iVar5 + 1;
    }
    UNLOCK();
  } while (!bVar7);
  iVar5 = nsync_dll_is_empty_(list);
  if (iVar5 == 0) {
    pvVar3 = e->container;
    lVar2 = (long)pvVar3 + 0x68;
    lVar4 = *(long *)((long)pvVar3 + 0x68);
    if (lVar4 == lVar2) {
      pnVar6 = nsync_dll_last_(list);
      if (p != pnVar6) {
        nsync_maybe_merge_conditions_(p,n);
      }
    }
    else {
      *(undefined8 *)(lVar4 + 8) = *(undefined8 *)((long)pvVar3 + 0x70);
      **(long **)((long)pvVar3 + 0x70) = lVar4;
      *(long *)((long)pvVar3 + 0x68) = lVar2;
      *(long *)((long)pvVar3 + 0x70) = lVar2;
    }
  }
  return list;
}

Assistant:

nsync_dll_list_ nsync_remove_from_mu_queue_ (nsync_dll_list_ mu_queue, nsync_dll_element_ *e) {
	/* Record previous and next elements in the original queue. */
	nsync_dll_element_ *prev = e->prev;
	nsync_dll_element_ *next = e->next;
	uint32_t old_value;
	/* Remove. */
	mu_queue = nsync_dll_remove_ (mu_queue, e);
        do {    
                old_value = ATM_LOAD (&DLL_WAITER (e)->remove_count);
        } while (!ATM_CAS (&DLL_WAITER (e)->remove_count, old_value, old_value+1));
	if (!nsync_dll_is_empty_ (mu_queue)) {
		/* Fix up same_condition. */
		nsync_dll_element_ *e_same_condition = &DLL_WAITER (e)->same_condition;

		if (e_same_condition->next != e_same_condition) {
			/* *e is linked to a same_condition neighbour---just remove it. */
			e_same_condition->next->prev = e_same_condition->prev;
			e_same_condition->prev->next = e_same_condition->next;
			e_same_condition->next = e_same_condition;
			e_same_condition->prev = e_same_condition;
		} else if (prev != nsync_dll_last_ (mu_queue)) {
			/* Merge the new neighbours together if we can. */
			nsync_maybe_merge_conditions_ (prev, next);
		}
	}
	return (mu_queue);
}